

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O2

void __thiscall
absl::lts_20250127::Cord::InlineRep::SetTree
          (InlineRep *this,Nonnull<CordRep_*> rep,CordzUpdateScope *scope)

{
  if (rep == (Nonnull<CordRep_*>)0x0) {
    __assert_fail("rep",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.h"
                  ,0x4f6,
                  "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                 );
  }
  if (((this->data_).rep_.field_0.data[0] & 1U) != 0) {
    cord_internal::InlineData::set_tree(&this->data_,rep);
    cord_internal::CordzUpdateScope::SetCordRep(scope,rep);
    return;
  }
  __assert_fail("data_.is_tree()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.h"
                ,0x4f7,
                "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
               );
}

Assistant:

inline void Cord::InlineRep::SetTree(absl::Nonnull<CordRep*> rep,
                                     const CordzUpdateScope& scope) {
  assert(rep);
  assert(data_.is_tree());
  data_.set_tree(rep);
  scope.SetCordRep(rep);
}